

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall
Diligent::GLContextState::BindSampler(GLContextState *this,Uint32 Index,GLSamplerObj *GLSampler)

{
  GLuint GVar1;
  pointer piVar2;
  int iVar3;
  Uint32 Index_local;
  GLenum err;
  string msg;
  
  Index_local = Index;
  if ((ulong)((long)(this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)Index) {
    msg._M_dataplus._M_p._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_BoundSamplers,(ulong)Index + 1,(value_type_conflict4 *)&msg);
  }
  piVar2 = (this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  GVar1 = GLSampler->m_uiHandle;
  if (GVar1 == 0) {
    iVar3 = 0;
  }
  else {
    if ((GLSampler->m_UniqueId).m_ID == 0) {
      LOCK();
      UNLOCK();
      iVar3 = UniqueIdHelper<GLObjectWrappers::GLSamplerCreateReleaseHelper>::GetID()::GlobalCounter
              + 1;
      UniqueIdHelper<GLObjectWrappers::GLSamplerCreateReleaseHelper>::GetID()::GlobalCounter =
           UniqueIdHelper<GLObjectWrappers::GLSamplerCreateReleaseHelper>::GetID()::GlobalCounter +
           1;
      (GLSampler->m_UniqueId).m_ID = iVar3;
    }
    iVar3 = (GLSampler->m_UniqueId).m_ID;
  }
  if (piVar2[Index_local] != iVar3) {
    piVar2[Index_local] = iVar3;
    (*__glewBindSampler)(Index_local,GVar1);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[32],unsigned_int,char[17],unsigned_int>
                (false,"BindSampler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x103,(char (*) [32])"Failed to bind sampler to slot ",&Index_local,
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x32952e);
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "BindSampler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x103);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                        msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void GLContextState::BindSampler(Uint32 Index, const GLObjectWrappers::GLSamplerObj& GLSampler)
{
    if (static_cast<size_t>(Index) >= m_BoundSamplers.size())
        m_BoundSamplers.resize(size_t{Index} + 1, -1);

    GLuint GLSamplerHandle = 0;
    if (UpdateBoundObject(m_BoundSamplers[Index], GLSampler, GLSamplerHandle))
    {
        glBindSampler(Index, GLSamplerHandle);
        DEV_CHECK_GL_ERROR("Failed to bind sampler to slot ", Index);
    }
}